

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O1

spv_result_t spvtools::val::TypePass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint16_t uVar2;
  pointer ppVar3;
  bool bVar4;
  bool bVar5;
  int32_t iVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  StorageClass SVar10;
  spv_result_t sVar11;
  StorageClass SVar12;
  ExecutionMode EVar13;
  Instruction *pIVar14;
  ulong uVar15;
  ulong uVar16;
  pointer puVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  _Base_ptr p_Var20;
  DiagnosticStream *pDVar21;
  __node_base_ptr p_Var22;
  Instruction *pIVar23;
  Instruction *extraout_RAX;
  Instruction *pIVar24;
  __buckets_ptr pp_Var25;
  __node_base_ptr p_Var27;
  long lVar28;
  __node_base _Var29;
  mapped_type mVar30;
  spv_result_t unaff_EBP;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> *pair;
  pointer ppVar31;
  __buckets_ptr pp_Var32;
  char *pcVar33;
  Op opcode;
  _Rb_tree_header *p_Var34;
  _Any_data *this;
  size_t sVar35;
  byte bVar36;
  uint64_t dim_value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> const_inst;
  int64_t num_components_value;
  __node_gen_type __node_gen;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [24];
  size_t local_2a0;
  __node_base_ptr p_Stack_298;
  __buckets_ptr local_290;
  ValidationState_t *local_288;
  __node_base local_280;
  _Any_data local_278;
  undefined1 local_268 [24];
  string local_250;
  __buckets_ptr local_230;
  undefined1 local_228 [16];
  __node_base_ptr local_218;
  __node_base _Stack_210;
  _Rb_tree_color local_208;
  spv_result_t local_58;
  string local_50;
  undefined7 uVar26;
  
  iVar6 = spvOpcodeGeneratesType((uint)(inst->inst_).opcode);
  if ((iVar6 == 0) && ((inst->inst_).opcode != 0x27)) {
    return SPV_SUCCESS;
  }
  bVar4 = EnumSet<spvtools::Extension>::contains
                    (&_->module_extensions_,kSPV_VALIDATOR_ignore_type_decl_unique);
  sVar11 = SPV_SUCCESS;
  if (!bVar4) {
    uVar1 = (inst->inst_).opcode;
    if ((((0x20 < (ulong)uVar1) || ((0x170000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
        (uVar1 != 0x1141)) &&
       ((sVar11 = SPV_SUCCESS, uVar1 != 0x13d4 &&
        (bVar4 = ValidationState_t::RegisterUniqueTypeDeclaration(_,inst), !bVar4)))) {
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,
                 "Duplicate non-aggregate type declarations are not allowed. Opcode: ",0x43);
      local_2c8._0_8_ = spvOpcodeString((uint)uVar1);
      pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_228,(char **)local_2c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21," id: ",5);
      std::ostream::_M_insert<unsigned_long>((ulong)pDVar21);
      sVar11 = pDVar21->error_;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
    }
  }
  if (sVar11 != SPV_SUCCESS) {
    return sVar11;
  }
  uVar1 = (inst->inst_).opcode;
  if (0x1140 < uVar1) {
    if (uVar1 < 0x14ee) {
      if (uVar1 == 0x1141) {
        bVar4 = spvIsVulkanEnv(_->context_->target_env);
        if (!bVar4) goto LAB_0066aa9b;
        SVar12 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
        bVar4 = true;
        if ((int)SVar12 < 9) {
          if (SVar12 != StorageClassUniform) {
            if (SVar12 != StorageClassWorkgroup) goto LAB_0066aa54;
            bVar5 = EnumSet<spv::Capability>::contains
                              (&_->module_capabilities_,CapabilityWorkgroupMemoryExplicitLayoutKHR);
            if (!bVar5) {
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
              pcVar33 = 
              "Workgroup storage class untyped pointers in Vulkan require WorkgroupMemoryExplicitLayoutKHR be declared"
              ;
              lVar28 = 0x67;
              goto LAB_0066aa7b;
            }
          }
        }
        else if (((SVar12 != PushConstant) && (SVar12 != StorageBuffer)) &&
                (SVar12 != PhysicalStorageBuffer)) {
LAB_0066aa54:
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
          pcVar33 = 
          "In Vulkan, untyped pointers can only be used in an explicitly laid out storage class";
          lVar28 = 0x54;
LAB_0066aa7b:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar33,lVar28);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
          bVar4 = false;
          unaff_EBP = local_58;
        }
        if (bVar4) goto LAB_0066aa9b;
        goto LAB_0066ae28;
      }
      if (uVar1 == 0x1168) goto LAB_0066870e;
      if (uVar1 != 0x14a8) goto switchD_0066819e_caseD_19;
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar14 = ValidationState_t::FindDef(_,uVar7);
      if ((pIVar14 == (Instruction *)0x0) || (1 < (pIVar14->inst_).opcode - 0x15)) {
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"OpTypeCooperativeVectorNV Component Type <id> ",0x2e);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228," is not a scalar numerical type.",0x20);
        sVar11 = local_58;
        goto LAB_0066a320;
      }
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar14 = ValidationState_t::FindDef(_,uVar7);
      if ((pIVar14 == (Instruction *)0x0) ||
         (iVar6 = spvOpcodeIsConstant((uint)(pIVar14->inst_).opcode), iVar6 == 0)) {
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"OpTypeCooperativeVectorNV component count <id> ",0x2f);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
        pcVar33 = " is not a scalar constant type.";
        lVar28 = 0x1f;
        goto LAB_0066a312;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_278,&pIVar14->words_)
      ;
      pIVar14 = ValidationState_t::FindDef
                          (_,*(uint32_t *)(local_278._M_unused._M_function_pointer + 4));
      if ((pIVar14 == (Instruction *)0x0) || ((pIVar14->inst_).opcode != 0x15)) {
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"OpTypeCooperativeVectorNV component count <id> ",0x2f);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228," is not a constant integer type.",0x20);
        if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
          operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
        sVar11 = local_58;
      }
      else {
        bVar4 = ValidationState_t::EvalConstantValInt64(_,uVar7,(int64_t *)(local_268 + 0x18));
        if (bVar4) {
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_250._M_dataplus._M_p ==
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) ||
             ((bVar4 = true, (long)local_250._M_dataplus._M_p < 0 &&
              ((pIVar14->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[3] != 0)))) {
            ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228,"OpTypeCooperativeVectorNV component count <id> ",0x2f);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228," default value must be at least 1: found ",0x29);
            std::ostream::_M_insert<long>((long)local_228);
            pIVar14 = (Instruction *)(ulong)(uint)local_58;
            if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
              operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
            bVar4 = false;
          }
          sVar11 = (spv_result_t)pIVar14;
          if (!bVar4) goto LAB_0066aa34;
        }
        sVar11 = SPV_SUCCESS;
      }
LAB_0066aa34:
      if ((ValidationState_t *)local_278._M_unused._0_8_ != (ValidationState_t *)0x0) {
        operator_delete(local_278._M_unused._M_object,local_268._0_8_ - local_278._0_8_);
      }
    }
    else {
      if (uVar1 == 0x14ee) {
LAB_0066870e:
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
        pIVar14 = ValidationState_t::FindDef(_,uVar7);
        if ((pIVar14 == (Instruction *)0x0) || (1 < (pIVar14->inst_).opcode - 0x15)) {
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"OpTypeCooperativeMatrix Component Type <id> ",0x2c);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
          pcVar33 = " is not a scalar numerical type.";
          lVar28 = 0x20;
        }
        else {
          uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
          pIVar14 = ValidationState_t::FindDef(_,uVar7);
          if (((pIVar14 == (Instruction *)0x0) ||
              (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar14->inst_).type_id), !bVar4)) ||
             (iVar6 = spvOpcodeIsConstant((uint)(pIVar14->inst_).opcode), iVar6 == 0)) {
            pDVar21 = (DiagnosticStream *)local_228;
            ValidationState_t::diag(pDVar21,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar21,"OpTypeCooperativeMatrix Scope <id> ",0x23);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar21,(char *)local_2c8._0_8_,local_2c8._8_8_);
            pcVar33 = " is not a constant instruction with scalar integer type.";
            lVar28 = 0x38;
            goto LAB_0066aafe;
          }
          uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,3);
          pIVar14 = ValidationState_t::FindDef(_,uVar9);
          if (((pIVar14 == (Instruction *)0x0) ||
              (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar14->inst_).type_id), !bVar4)) ||
             (iVar6 = spvOpcodeIsConstant((uint)(pIVar14->inst_).opcode), iVar6 == 0)) {
            ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
            pcVar33 = "OpTypeCooperativeMatrix Rows <id> ";
          }
          else {
            uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,4);
            pIVar14 = ValidationState_t::FindDef(_,uVar9);
            if (((pIVar14 != (Instruction *)0x0) &&
                (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar14->inst_).type_id), bVar4)) &&
               (iVar6 = spvOpcodeIsConstant((uint)(pIVar14->inst_).opcode), iVar6 != 0)) {
              if ((inst->inst_).opcode == 0x1168) {
                uVar9 = Instruction::GetOperandAs<unsigned_int>(inst,5);
                pIVar14 = ValidationState_t::FindDef(_,uVar9);
                if (((pIVar14 == (Instruction *)0x0) ||
                    (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar14->inst_).type_id), !bVar4)
                    ) || (iVar6 = spvOpcodeIsConstant((uint)(pIVar14->inst_).opcode), iVar6 == 0)) {
                  ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_228,"OpTypeCooperativeMatrixKHR Use <id> ",0x24);
                  ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_228,
                             " is not a constant instruction with scalar integer type.",0x38);
                  pIVar14 = (Instruction *)(ulong)(uint)local_58;
                  if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
                    operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
                  }
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
                  bVar4 = false;
                }
                else {
                  bVar4 = true;
                }
                sVar11 = (spv_result_t)pIVar14;
                if (!bVar4) goto joined_r0x0066a349;
              }
              sVar11 = (spv_result_t)pIVar14;
              bVar4 = ValidationState_t::EvalConstantValUint64
                                (_,uVar7,(uint64_t *)(local_268 + 0x18));
              if ((bVar4) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x2)) {
                _Var29._M_nxt =
                     (_Hash_node_base *)
                     (_->entry_points_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_288 = (ValidationState_t *)
                            (_->entry_points_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                pp_Var32 = (__buckets_ptr)(ulong)((ValidationState_t *)_Var29._M_nxt == local_288);
                if ((ValidationState_t *)_Var29._M_nxt != local_288) {
                  pp_Var32 = (__buckets_ptr)0x0;
                  do {
                    uVar8 = *(uint32_t *)&(_Var29._M_nxt)->_M_nxt;
                    bVar4 = ValidationState_t::EntryPointHasLocalSizeOrId(_,uVar8);
                    if (bVar4) {
                      p_Var22 = (_->entry_point_to_local_size_or_id_)._M_h._M_buckets
                                [(ulong)uVar8 %
                                 (_->entry_point_to_local_size_or_id_)._M_h._M_bucket_count];
                      for (p_Var27 = p_Var22->_M_nxt; *(uint32_t *)&p_Var27[1]._M_nxt != uVar8;
                          p_Var27 = p_Var27->_M_nxt) {
                        p_Var22 = p_Var27;
                      }
                      pIVar24 = (Instruction *)p_Var22->_M_nxt[2]._M_nxt;
                      local_280._M_nxt = _Var29._M_nxt;
                      EVar13 = Instruction::GetOperandAs<spv::ExecutionMode>(pIVar24,1);
                      pp_Var25 = (__buckets_ptr)0x1;
                      _Var29._M_nxt = local_280._M_nxt;
                      if (EVar13 == ExecutionModeLocalSizeId) {
                        local_230 = pp_Var32;
                        uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar24,2);
                        local_278._0_4_ = uVar7;
                        uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar24,3);
                        local_278._4_4_ = uVar7;
                        uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar24,4);
                        local_278._8_4_ = uVar7;
                        local_290 = (__buckets_ptr)0x0;
                        lVar28 = 0;
                        do {
                          uVar8 = *(uint32_t *)((long)&local_278 + lVar28);
                          pIVar23 = ValidationState_t::FindDef(_,uVar8);
                          pIVar24 = pIVar23;
                          if (inst < pIVar23) {
                            ValidationState_t::diag
                                      ((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_228,
                                       "OpTypeCooperativeMatrixKHR with ScopeWorkgroup ",0x2f);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_228,
                                       "used before LocalSizeId constant value <id> ",0x2c);
                            ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar8);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_)
                            ;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_228," is defined.",0xc);
                            pIVar14 = (Instruction *)(ulong)(uint)local_58;
                            if ((ValidationState_t *)local_2c8._0_8_ !=
                                (ValidationState_t *)local_2b8) {
                              operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
                            }
                            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
                            pIVar24 = extraout_RAX;
                          }
                          pp_Var25 = local_290;
                          _Var29._M_nxt = local_280._M_nxt;
                          pp_Var32 = local_230;
                          if (inst < pIVar23) break;
                          lVar28 = lVar28 + 4;
                          pp_Var25 = (__buckets_ptr)
                                     CONCAT71((int7)((ulong)pIVar24 >> 8),lVar28 == 0xc);
                          local_290 = pp_Var25;
                        } while (lVar28 != 0xc);
                      }
                    }
                    else {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,
                                 "OpTypeCooperativeMatrixKHR with ScopeWorkgroup ",0x2f);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,
                                 "used without specifying LocalSize or LocalSizeId ",0x31);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,"for entry point <id> ",0x15);
                      ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
                      pIVar14 = (Instruction *)(ulong)(uint)local_58;
                      if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
                        operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
                      }
                      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
                      pp_Var25 = (__buckets_ptr)0x0;
                    }
                    sVar11 = (spv_result_t)pIVar14;
                    if (((ulong)pp_Var25 & 1) == 0) break;
                    _Var29._M_nxt = (_Hash_node_base *)((long)&(_Var29._M_nxt)->_M_nxt + 4);
                    pp_Var32 = (__buckets_ptr)
                               CONCAT71((int7)((ulong)pp_Var32 >> 8),
                                        (ValidationState_t *)_Var29._M_nxt == local_288);
                  } while ((ValidationState_t *)_Var29._M_nxt != local_288);
                }
                if (((ulong)pp_Var32 & 1) == 0) goto joined_r0x0066a349;
              }
              sVar11 = SPV_SUCCESS;
              goto joined_r0x0066a349;
            }
            ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
            pcVar33 = "OpTypeCooperativeMatrix Cols <id> ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar33,0x22);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
          pcVar33 = " is not a constant instruction with scalar integer type.";
          lVar28 = 0x38;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar33,lVar28);
        sVar11 = local_58;
        goto LAB_0066ab15;
      }
      if (uVar1 != 0x14fa) {
        if (uVar1 != 0x14fb) goto switchD_0066819e_caseD_19;
        unaff_EBP = anon_unknown_2::ValidateTensorDim(_,inst);
        if (unaff_EBP == SPV_SUCCESS) {
          uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
          pIVar14 = ValidationState_t::FindDef(_,uVar7);
          if ((pIVar14 == (Instruction *)0x0) ||
             (bVar4 = ValidationState_t::IsBoolScalarType(_,(pIVar14->inst_).type_id), !bVar4)) {
            ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
            local_278._M_unused._0_8_ = (undefined8)spvOpcodeString((uint)(inst->inst_).opcode);
            pDVar21 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)local_228,(char **)&local_278);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar21," HasDimensions <id> ",0x14);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar21,(char *)local_2c8._0_8_,local_2c8._8_8_);
            pcVar33 = " is not a boolean value.";
            lVar28 = 0x18;
            goto LAB_00669bb9;
          }
          uVar15 = (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          local_288 = (ValidationState_t *)(((long)uVar15 >> 4) + -3);
          uVar26 = (undefined7)(uVar15 >> 8);
          uVar16 = CONCAT71(uVar26,uVar15 >= 0x31);
          if (uVar15 < 0x31) {
            local_280._M_nxt = (_Hash_node_base *)((ulong)local_280._M_nxt._4_4_ << 0x20);
            uVar7 = 1;
          }
          else {
            local_290 = (__buckets_ptr)CONCAT71(local_290._1_7_,1);
            local_280._M_nxt = (_Hash_node_base *)((ulong)local_280._M_nxt._4_4_ << 0x20);
            sVar35 = 3;
            local_230 = (__buckets_ptr)CONCAT44(local_230._4_4_,(int)CONCAT71(uVar26,1));
            do {
              uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,sVar35);
              pIVar14 = ValidationState_t::FindDef(_,uVar7);
              if (((pIVar14 == (Instruction *)0x0) ||
                  (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar14->inst_).type_id), !bVar4))
                 || (uVar8 = ValidationState_t::GetBitWidth(_,(pIVar14->inst_).type_id),
                    uVar8 != 0x20)) {
                ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
                local_278._M_unused._0_8_ = (undefined8)spvOpcodeString((uint)(inst->inst_).opcode);
                pDVar21 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)local_228,(char **)&local_278);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar21," Permutation <id> ",0x12);
                ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar21,(char *)local_2c8._0_8_,local_2c8._8_8_);
                lVar28 = 0x19;
                pcVar33 = " is not a 32-bit integer.";
LAB_00668617:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar21,pcVar33,lVar28);
                unaff_EBP = pDVar21->error_;
                if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
                  operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
                }
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
                bVar4 = false;
              }
              else {
                bVar5 = ValidationState_t::EvalConstantValUint64
                                  (_,uVar7,(uint64_t *)local_278._M_pod_data);
                bVar4 = true;
                if (bVar5) {
                  if (local_288 <= local_278._M_unused._M_object) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
                    local_250._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
                    pDVar21 = DiagnosticStream::operator<<
                                        ((DiagnosticStream *)local_228,(char **)(local_268 + 0x18));
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar21," Permutation <id> ",0x12);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar21,(char *)local_2c8._0_8_,local_2c8._8_8_);
                    lVar28 = 0x1b;
                    pcVar33 = " must be a valid dimension.";
                    goto LAB_00668617;
                  }
                  local_280._M_nxt._0_4_ =
                       (uint)local_280._M_nxt |
                       1 << ((uint)local_278._M_unused._M_member_pointer & 0x1f);
                }
                else {
                  local_230 = (__buckets_ptr)((ulong)local_230 & 0xffffffff00000000);
                }
              }
              if (!bVar4) break;
              sVar35 = sVar35 + 1;
              bVar4 = sVar35 < (ulong)((long)(inst->operands_).
                                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(inst->operands_).
                                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 4);
              local_290 = (__buckets_ptr)CONCAT71(local_290._1_7_,bVar4);
            } while (bVar4);
            uVar16 = (ulong)local_290 & 0xff;
            uVar7 = (uint)local_230;
          }
          if ((uVar16 & 1) == 0) {
            if (((uVar7 & 1) == 0) ||
               (((uint)local_280._M_nxt ^ -1 << ((byte)local_288 & 0x1f)) == 0xffffffff)) {
              uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
              bVar4 = ValidationState_t::EvalConstantValUint64(_,uVar7,(uint64_t *)local_2c8);
              unaff_EBP = SPV_SUCCESS;
              if ((!bVar4) || ((ValidationState_t *)local_2c8._0_8_ == local_288))
              goto LAB_0066ae28;
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
              local_278._M_unused._0_8_ = (undefined8)spvOpcodeString((uint)(inst->inst_).opcode);
              pDVar21 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)local_228,(char **)&local_278);
              pcVar33 = " Incorrect number of permutation values.";
              lVar28 = 0x28;
            }
            else {
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
              local_2c8._0_8_ = spvOpcodeString((uint)(inst->inst_).opcode);
              pDVar21 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)local_228,(char **)local_2c8);
              pcVar33 = " Permutation values don\'t form a valid permutation.";
              lVar28 = 0x33;
            }
LAB_0066acc0:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21,pcVar33,lVar28);
            local_58 = pDVar21->error_;
            goto LAB_0066a670;
          }
        }
        goto LAB_0066ae28;
      }
      sVar11 = anon_unknown_2::ValidateTensorDim(_,inst);
      if (sVar11 == SPV_SUCCESS) {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar14 = ValidationState_t::FindDef(_,uVar7);
        if (((pIVar14 == (Instruction *)0x0) ||
            (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar14->inst_).type_id), !bVar4)) ||
           (uVar8 = ValidationState_t::GetBitWidth(_,(pIVar14->inst_).type_id), uVar8 != 0x20)) {
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
          local_278._M_unused._0_8_ = (undefined8)spvOpcodeString((uint)(inst->inst_).opcode);
          pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_228,(char **)&local_278);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar21," ClampMode <id> ",0x10);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar21,(char *)local_2c8._0_8_,local_2c8._8_8_);
          pcVar33 = " is not a 32-bit integer.";
          lVar28 = 0x19;
        }
        else {
          bVar4 = ValidationState_t::EvalConstantValUint64
                            (_,uVar7,(uint64_t *)local_278._M_pod_data);
          sVar11 = SPV_SUCCESS;
          if ((!bVar4) || (local_278._M_unused._M_object < (ValidationState_t *)0x5))
          goto joined_r0x0066a349;
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
          local_250._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
          pDVar21 = DiagnosticStream::operator<<
                              ((DiagnosticStream *)local_228,(char **)(local_268 + 0x18));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar21," ClampMode <id> ",0x10);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar21,(char *)local_2c8._0_8_,local_2c8._8_8_);
          pcVar33 = " must be a valid TensorClampMode.";
          lVar28 = 0x21;
        }
        goto LAB_0066aafe;
      }
    }
    goto joined_r0x0066a349;
  }
  switch(uVar1) {
  case 0x15:
    uVar7 = Instruction::GetOperandAs<unsigned_int_const>(inst,1);
    switch(uVar7 << 0x1d | uVar7 - 8 >> 3) {
    case 0:
      if ((_->features_).declare_int8_type != false) {
LAB_0066aa9b:
        unaff_EBP = SPV_SUCCESS;
        goto LAB_0066ae28;
      }
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar33 = 
      "Using an 8-bit integer type requires the Int8 capability, or an extension that explicitly enables 8-bit integers."
      ;
      lVar28 = 0x71;
      break;
    case 1:
      if ((_->features_).declare_int16_type != false) goto LAB_0066aa9b;
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar33 = 
      "Using a 16-bit integer type requires the Int16 capability, or an extension that explicitly enables 16-bit integers."
      ;
      lVar28 = 0x73;
      break;
    default:
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"Invalid number of bits (",0x18);
      std::ostream::_M_insert<unsigned_long>((ulong)local_228);
      pcVar33 = ") used for OpTypeInt.";
      lVar28 = 0x15;
      break;
    case 3:
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      if (uVar7 < 2) {
        unaff_EBP = SPV_SUCCESS;
        if ((((inst->inst_).opcode != 0x15) ||
            (bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel),
            !bVar4)) || (uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2), uVar7 == 0))
        goto LAB_0066ae28;
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_BINARY,inst);
        pcVar33 = "The Signedness in OpTypeInt must always be 0 when Kernel capability is used.";
        lVar28 = 0x4c;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_VALUE,inst);
        pcVar33 = "OpTypeInt has invalid signedness:";
        lVar28 = 0x21;
      }
      break;
    case 7:
      bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityInt64);
      if (bVar4) goto LAB_0066aa9b;
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar33 = "Using a 64-bit integer type requires the Int64 capability.";
      lVar28 = 0x3a;
    }
    goto LAB_0066a65f;
  case 0x16:
    uVar7 = Instruction::GetOperandAs<unsigned_int_const>(inst,1);
    sVar11 = SPV_SUCCESS;
    if (uVar7 == 0x40) {
      bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityFloat64);
      if (!bVar4) {
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"Using a 64-bit floating point ",0x1e);
        pcVar33 = "type requires the Float64 capability.";
        lVar28 = 0x25;
        goto LAB_00669ef2;
      }
    }
    else if (uVar7 != 0x20) {
      if (uVar7 == 0x10) {
        if ((_->features_).declare_float16_type != false) break;
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"Using a 16-bit floating point ",0x1e);
        pcVar33 = 
        "type requires the Float16 or Float16Buffer capability, or an extension that explicitly enables 16-bit floating point."
        ;
        lVar28 = 0x75;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"Invalid number of bits (",0x18);
        std::ostream::_M_insert<unsigned_long>((ulong)local_228);
        pcVar33 = ") used for OpTypeFloat.";
        lVar28 = 0x17;
      }
LAB_00669ef2:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar33,lVar28);
      sVar11 = local_58;
      goto LAB_0066ab2f;
    }
    break;
  case 0x17:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar14 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar14 != (Instruction *)0x0) &&
       (iVar6 = spvOpcodeIsScalarType((uint)(pIVar14->inst_).opcode), iVar6 != 0)) {
      uVar7 = Instruction::GetOperandAs<unsigned_int_const>(inst,2);
      unaff_EBP = SPV_SUCCESS;
      if (2 < uVar7 - 2) {
        if ((uVar7 != 0x10) && (uVar7 != 8)) {
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"Illegal number of components (",0x1e);
          std::ostream::_M_insert<unsigned_long>((ulong)local_228);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,") for ",6);
          local_2c8._0_8_ = spvOpcodeString((uint)(inst->inst_).opcode);
          pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_228,(char **)local_2c8);
          local_58 = pDVar21->error_;
          goto LAB_0066a670;
        }
        bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityVector16);
        if (!bVar4) {
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"Having ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)local_228);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228," components for ",0x10);
          local_2c8._0_8_ = spvOpcodeString((uint)(inst->inst_).opcode);
          pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_228,(char **)local_2c8);
          pcVar33 = " requires the Vector16 capability";
          lVar28 = 0x21;
          goto LAB_0066acc0;
        }
      }
      goto LAB_0066ae28;
    }
    ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"OpTypeVector Component Type <id> ",0x21);
    ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
    pcVar33 = " is not a scalar type.";
    lVar28 = 0x16;
LAB_0066999c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar33,lVar28);
LAB_006699ac:
    if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
      operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
    }
    goto LAB_0066a670;
  case 0x18:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar14 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar14 == (Instruction *)0x0) || ((pIVar14->inst_).opcode != 0x17)) {
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar33 = "Columns in a matrix must be of type vector.";
      lVar28 = 0x2b;
    }
    else {
      uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
      pIVar14 = ValidationState_t::FindDef(_,uVar7);
      if ((pIVar14->inst_).opcode == 0x16) {
        uVar7 = Instruction::GetOperandAs<unsigned_int_const>(inst,2);
        unaff_EBP = SPV_SUCCESS;
        if (0xfffffffc < uVar7 - 5) goto LAB_0066ae28;
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar33 = "Matrix types can only be parameterized as having only 2, 3, or 4 columns.";
        lVar28 = 0x49;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar33 = "Matrix types can only be parameterized with floating-point types.";
        lVar28 = 0x41;
      }
    }
    goto LAB_0066a65f;
  default:
    goto switchD_0066819e_caseD_19;
  case 0x1c:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar14 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar14 == (Instruction *)0x0) ||
       (iVar6 = spvOpcodeGeneratesType((uint)(pIVar14->inst_).opcode), iVar6 == 0)) {
      pDVar21 = (DiagnosticStream *)local_228;
      ValidationState_t::diag(pDVar21,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar21,"OpTypeArray Element Type <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar21,(char *)local_2c8._0_8_,local_2c8._8_8_);
      pcVar33 = " is not a type.";
      lVar28 = 0xf;
    }
    else {
      if ((pIVar14->inst_).opcode != 0x13) {
        bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if ((((bVar4) && ((pIVar14->inst_).opcode == 0x1e)) &&
            ((bVar4 = ValidationState_t::HasDecoration(_,(pIVar14->inst_).result_id,Block), bVar4 ||
             (bVar4 = ValidationState_t::HasDecoration(_,(pIVar14->inst_).result_id,BufferBlock),
             bVar4)))) &&
           (bVar4 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,ArrayStride), bVar4))
        {
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
          pcVar33 = "Array containing a Block or BufferBlock must not be decorated with ArrayStride"
          ;
          lVar28 = 0x4e;
          goto LAB_00669ef2;
        }
        bVar4 = spvIsVulkanEnv(_->context_->target_env);
        if ((bVar4) && ((pIVar14->inst_).opcode == 0x1d)) {
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2c8,_,0x1248,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"OpTypeArray Element Type <id> ",0x1e);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_278,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,(char *)local_278._M_unused._0_8_,local_278._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228," is not valid in ",0x11);
          spvLogStringForEnv_abi_cxx11_((string *)(local_268 + 0x18),_->context_->target_env);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,local_250._M_dataplus._M_p,local_250._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228," environments.",0xe);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          sVar11 = local_58;
          if ((ValidationState_t *)local_278._M_unused._0_8_ != (ValidationState_t *)local_268) {
            operator_delete(local_278._M_unused._M_object,
                            (ulong)((long)(spv_target_env *)local_268._0_8_ + 1));
          }
          goto LAB_0066ab15;
        }
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar14 = ValidationState_t::FindDef(_,uVar7);
        if ((pIVar14 == (Instruction *)0x0) ||
           (iVar6 = spvOpcodeIsConstant((uint)(pIVar14->inst_).opcode), iVar6 == 0)) {
          pDVar21 = (DiagnosticStream *)local_228;
          ValidationState_t::diag(pDVar21,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar21,"OpTypeArray Length <id> ",0x18);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar21,(char *)local_2c8._0_8_,local_2c8._8_8_);
          pcVar33 = " is not a scalar constant type.";
          lVar28 = 0x1f;
          goto LAB_0066aafe;
        }
        this = &local_278;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,&pIVar14->words_);
        pIVar14 = ValidationState_t::FindDef
                            (_,*(uint32_t *)(local_278._M_unused._M_function_pointer + 4));
        if ((pIVar14 == (Instruction *)0x0) || ((pIVar14->inst_).opcode != 0x15)) {
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"OpTypeArray Length <id> ",0x18);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228," is not a constant integer type.",0x20);
          if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
            operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
          sVar11 = local_58;
        }
        else {
          bVar4 = ValidationState_t::EvalConstantValInt64(_,uVar7,(int64_t *)(local_268 + 0x18));
          if (bVar4) {
            if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_250._M_dataplus._M_p ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0) ||
               ((bVar4 = true, (long)local_250._M_dataplus._M_p < 0 &&
                ((pIVar14->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[3] != 0)))) {
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,"OpTypeArray Length <id> ",0x18);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228," default value must be at least 1: found ",0x29);
              std::ostream::_M_insert<long>((long)local_228);
              this = (_Any_data *)(ulong)(uint)local_58;
              if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
                operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
              bVar4 = false;
            }
            sVar11 = (spv_result_t)this;
            if (!bVar4) goto LAB_0066aece;
          }
          sVar11 = SPV_SUCCESS;
        }
LAB_0066aece:
        if ((ValidationState_t *)local_278._M_unused._0_8_ != (ValidationState_t *)0x0) {
          operator_delete(local_278._M_unused._M_object,local_268._0_8_ - local_278._0_8_);
        }
        break;
      }
      pDVar21 = (DiagnosticStream *)local_228;
      ValidationState_t::diag(pDVar21,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar21,"OpTypeArray Element Type <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar21,(char *)local_2c8._0_8_,local_2c8._8_8_);
      pcVar33 = " is a void type.";
      lVar28 = 0x10;
    }
LAB_0066aafe:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21,pcVar33,lVar28);
    sVar11 = pDVar21->error_;
LAB_0066ab15:
    if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
      operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
    }
LAB_0066ab2f:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
    break;
  case 0x1d:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar14 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar14 == (Instruction *)0x0) ||
       (iVar6 = spvOpcodeGeneratesType((uint)(pIVar14->inst_).opcode), iVar6 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"OpTypeRuntimeArray Element Type <id> ",0x25);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
      pcVar33 = " is not a type.";
      lVar28 = 0xf;
LAB_00669893:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar33,lVar28);
LAB_006698aa:
      if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
        operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
      }
    }
    else {
      if ((pIVar14->inst_).opcode == 0x13) {
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"OpTypeRuntimeArray Element Type <id> ",0x25);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
        pcVar33 = " is a void type.";
        lVar28 = 0x10;
        goto LAB_00669893;
      }
      bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if ((((!bVar4) || ((pIVar14->inst_).opcode != 0x1e)) ||
          ((bVar4 = ValidationState_t::HasDecoration(_,(pIVar14->inst_).result_id,Block), !bVar4 &&
           (bVar4 = ValidationState_t::HasDecoration(_,(pIVar14->inst_).result_id,BufferBlock),
           !bVar4)))) ||
         (bVar4 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,ArrayStride), !bVar4))
      {
        bVar4 = spvIsVulkanEnv(_->context_->target_env);
        sVar11 = SPV_SUCCESS;
        if ((!bVar4) || (sVar11 = SPV_SUCCESS, (pIVar14->inst_).opcode != 0x1d)) break;
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2c8,_,0x1248,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"OpTypeRuntimeArray Element Type <id> ",0x25);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_278,_,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,(char *)local_278._M_unused._0_8_,local_278._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228," is not valid in ",0x11);
        spvLogStringForEnv_abi_cxx11_((string *)(local_268 + 0x18),_->context_->target_env);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,local_250._M_dataplus._M_p,local_250._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228," environments.",0xe);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((ValidationState_t *)local_278._M_unused._0_8_ != (ValidationState_t *)local_268) {
          operator_delete(local_278._M_unused._M_object,
                          (ulong)((long)(spv_target_env *)local_268._0_8_ + 1));
        }
        goto LAB_006698aa;
      }
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,
                 "Array containing a Block or BufferBlock must not be decorated with ArrayStride",
                 0x4e);
    }
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
    sVar11 = local_58;
    break;
  case 0x1e:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    local_280._M_nxt._0_4_ = uVar7;
    bVar36 = 0x10 < (ulong)((long)(inst->operands_).
                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(inst->operands_).
                                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
    if ((bool)bVar36) {
      sVar35 = 1;
      bVar36 = true;
      do {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,sVar35);
        if (uVar7 == (inst->inst_).result_id) {
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"Structure members may not be self references",0x2c);
          local_290 = (__buckets_ptr)CONCAT44(local_290._4_4_,local_58);
LAB_00668b79:
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
          bVar4 = false;
        }
        else {
          local_288 = (ValidationState_t *)CONCAT71(local_288._1_7_,bVar36);
          pIVar14 = ValidationState_t::FindDef(_,uVar7);
          if ((pIVar14 == (Instruction *)0x0) ||
             (iVar6 = spvOpcodeGeneratesType((uint)(pIVar14->inst_).opcode), iVar6 == 0)) {
            ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228,"OpTypeStruct Member Type <id> ",0x1e);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228," is not a type.",0xf);
            local_290 = (__buckets_ptr)CONCAT44(local_290._4_4_,local_58);
            if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
              operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
            }
LAB_00668c8d:
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
            bVar4 = false;
LAB_00668c94:
            bVar36 = (byte)local_288;
          }
          else {
            uVar2 = (pIVar14->inst_).opcode;
            if (uVar2 == 0x1e) {
              bVar4 = ValidationState_t::IsStructTypeWithBuiltInMember(_,uVar7);
              if (!bVar4) goto LAB_00668e1a;
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,"Structure <id> ",0xf);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,
                         " contains members with BuiltIn decoration. Therefore this ",0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,
                         "structure may not be contained as a member of another ",0x36);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,"structure ",10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,"type. Structure <id> ",0x15);
              ValidationState_t::getIdName_abi_cxx11_((string *)&local_278,_,(uint)local_280._M_nxt)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,(char *)local_278._M_unused._0_8_,local_278._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228," contains structure <id> ",0x19);
              ValidationState_t::getIdName_abi_cxx11_((string *)(local_268 + 0x18),_,uVar7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,local_250._M_dataplus._M_p,local_250._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,".",1);
              sVar11 = local_58;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p,
                                local_250.field_2._M_allocated_capacity + 1);
              }
LAB_00668fbe:
              bVar36 = (byte)local_288;
              if ((ValidationState_t *)local_278._M_unused._0_8_ != (ValidationState_t *)local_268)
              {
LAB_00668fd2:
                operator_delete(local_278._M_unused._M_object,
                                (ulong)((long)(spv_target_env *)local_268._0_8_ + 1));
              }
LAB_00668fdf:
              local_290 = (__buckets_ptr)CONCAT44(local_290._4_4_,sVar11);
              if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
                operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
              }
              goto LAB_00668b79;
            }
            if (uVar2 == 0x13) {
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,"Structures cannot contain a void type.",0x26);
              local_290 = (__buckets_ptr)CONCAT44(local_290._4_4_,local_58);
              goto LAB_00668c8d;
            }
LAB_00668e1a:
            bVar5 = spvIsVulkanEnv(_->context_->target_env);
            bVar4 = true;
            if ((!bVar5) || ((pIVar14->inst_).opcode != 0x1d)) goto LAB_00668c94;
            if (sVar35 != ((long)(inst->operands_).
                                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(inst->operands_).
                                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U) {
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
              ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2c8,_,0x1248,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"In ",3);
              spvLogStringForEnv_abi_cxx11_((string *)&local_278,_->context_->target_env);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,(char *)local_278._M_unused._0_8_,local_278._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,
                         ", OpTypeRuntimeArray must only be used for the last member of an OpTypeStruct"
                         ,0x4d);
              sVar11 = local_58;
              goto LAB_00668fbe;
            }
            bVar5 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,Block);
            bVar36 = (byte)local_288;
            if ((!bVar5) &&
               (bVar5 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,BufferBlock),
               !bVar5)) {
              ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
              ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2c8,_,0x1248,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
              spvLogStringForEnv_abi_cxx11_((string *)&local_278,_->context_->target_env);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,(char *)local_278._M_unused._0_8_,local_278._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,", OpTypeStruct containing an OpTypeRuntimeArray ",
                         0x30);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,"must be decorated with Block or BufferBlock.",0x2c);
              sVar11 = local_58;
              if ((ValidationState_t *)local_278._M_unused._0_8_ != (ValidationState_t *)local_268)
              goto LAB_00668fd2;
              goto LAB_00668fdf;
            }
          }
        }
        if (!bVar4) break;
        sVar35 = sVar35 + 1;
        bVar36 = sVar35 < (ulong)((long)(inst->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(inst->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4);
      } while ((bool)bVar36);
    }
    unaff_EBP = (spv_result_t)local_290;
    if ((bVar36 & 1) == 0) {
      puVar17 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(inst->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar17) < 9) {
        mVar30 = false;
      }
      else {
        uVar15 = 2;
        do {
          local_228._8_8_ = (_Hash_node_base *)0x0;
          _Stack_210._M_nxt =
               (_Hash_node_base *)
               std::
               _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_type.cpp:423:13)>
               ::_M_invoke;
          local_218 = (__node_base_ptr)
                      std::
                      _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_type.cpp:423:13)>
                      ::_M_manager;
          local_228._0_8_ = _;
          bVar4 = ValidationState_t::ContainsType
                            (_,puVar17[uVar15],
                             (function<bool_(const_spvtools::val::Instruction_*)>_conflict *)
                             local_228,false);
          if (local_218 != (__node_base_ptr)0x0) {
            (*(code *)local_218)
                      ((function<bool_(const_spvtools::val::Instruction_*)>_conflict *)local_228,
                       (function<bool_(const_spvtools::val::Instruction_*)>_conflict *)local_228,3);
          }
          mVar30 = false;
          if (bVar4) {
            mVar30 = true;
            break;
          }
          uVar15 = uVar15 + 1;
          puVar17 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar15 < (ulong)((long)(inst->words_).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar17
                                 >> 2));
      }
      local_228._0_4_ = (inst->inst_).result_id;
      pmVar18 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&_->struct_has_nested_blockorbufferblock_struct_,
                             (key_type *)local_228);
      *pmVar18 = mVar30;
      local_228._0_4_ = (inst->inst_).result_id;
      pmVar18 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&_->struct_has_nested_blockorbufferblock_struct_,
                             (key_type *)local_228);
      if ((*pmVar18 == true) &&
         ((bVar4 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,BufferBlock), bVar4 ||
          (bVar4 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,Block), bVar4)))) {
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,
                   "rules: A Block or BufferBlock cannot be nested within another Block or BufferBlock. "
                   ,0x54);
        unaff_EBP = local_58;
LAB_0066a20c:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
      }
      else {
        local_2c8._0_8_ = &p_Stack_298;
        local_2c8._8_8_ = (spv_const_validator_options)0x1;
        local_2b8._0_8_ = 0;
        local_2b8._8_8_ = 0;
        local_2b8._16_4_ = 1.0;
        local_2a0 = 0;
        p_Stack_298 = (__node_base_ptr)0x0;
        local_228._0_4_ = (uint)local_280._M_nxt;
        pmVar19 = std::
                  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                  ::operator[](&_->id_decorations_,(key_type_conflict *)local_228);
        p_Var20 = (pmVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var34 = &(pmVar19->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var20 != p_Var34) {
          do {
            local_228._0_4_ = p_Var20[1]._M_color;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_228 + 8),
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var20[1]._M_parent)
            ;
            local_208 = p_Var20[2]._M_color;
            if (((float)local_228._0_4_ == 1.54143e-44) && (local_208 != ~_S_red)) {
              local_250._M_dataplus._M_p._0_4_ = local_208;
              local_278._M_unused._M_object = (ValidationState_t *)local_2c8;
              std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((ValidationState_t *)local_2c8,
                         (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)(local_268 + 0x18),&local_278);
            }
            if ((_Hash_node_base *)local_228._8_8_ != (_Hash_node_base *)0x0) {
              operator_delete((void *)local_228._8_8_,(long)_Stack_210._M_nxt - local_228._8_8_);
            }
            p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
          } while ((_Rb_tree_header *)p_Var20 != p_Var34);
        }
        if (((int)local_2b8._8_4_ < 1) ||
           ((int)((ulong)((long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1 ==
            local_2b8._8_4_)) {
          if (0 < (int)local_2b8._8_4_) {
            local_278._0_4_ = (uint)local_280._M_nxt;
            local_228._0_8_ = &_->builtin_structs_;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ();
          }
          bVar4 = spvIsVulkanEnv(_->context_->target_env);
          if ((bVar4) && (_->options_->before_hlsl_legalization == false)) {
            local_278._8_8_ = 0;
            local_268._8_8_ =
                 std::
                 _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_type.cpp:469:29)>
                 ::_M_invoke;
            local_268._0_8_ =
                 std::
                 _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_type.cpp:469:29)>
                 ::_M_manager;
            local_278._M_unused._M_object = _;
            bVar5 = ValidationState_t::ContainsType
                              (_,(inst->inst_).result_id,
                               (function<bool_(const_spvtools::val::Instruction_*)>_conflict *)
                               &local_278,true);
            bVar4 = true;
          }
          else {
            bVar4 = false;
            bVar5 = false;
          }
          if ((bVar4) && ((spv_const_context)local_268._0_8_ != (spv_const_context)0x0)) {
            (*(code *)local_268._0_8_)(&local_278,&local_278,3);
          }
          unaff_EBP = SPV_SUCCESS;
          if (bVar5 != false) {
            ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
            ValidationState_t::VkErrorID_abi_cxx11_
                      ((string *)(local_268 + 0x18),_,0x123b,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228,local_250._M_dataplus._M_p,local_250._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"In ",3);
            spvLogStringForEnv_abi_cxx11_(&local_50,_->context_->target_env);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228,local_50._M_dataplus._M_p,local_50._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228,", OpTypeStruct must not contain an opaque type.",0x2f);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,
                              (ulong)(local_50.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
            unaff_EBP = local_58;
          }
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,
                     "When BuiltIn decoration is applied to a structure-type member, ",0x3f);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,
                     "all members of that structure type must also be decorated with ",0x3f);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"BuiltIn (No allowed mixing of built-in variables and ",
                     0x35);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,
                     "non-built-in variables within a single structure). Structure id ",0x40);
          std::ostream::_M_insert<unsigned_long>((ulong)local_228);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228," does not meet this requirement.",0x20);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
          unaff_EBP = local_58;
        }
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_2c8);
      }
    }
    goto LAB_0066ae28;
  case 0x20:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar14 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar14 == (Instruction *)0x0) ||
       (iVar6 = spvOpcodeGeneratesType((uint)(pIVar14->inst_).opcode), iVar6 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"OpTypePointer Type <id> ",0x18);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
      pcVar33 = " is not a type.";
      lVar28 = 0xf;
    }
    else {
      SVar12 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
      if (SVar12 == StorageClassUniformConstant) {
        if (((pIVar14->inst_).opcode & 0xfffe) == 0x1c) {
          uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar14,1);
          pIVar14 = ValidationState_t::FindDef(_,uVar7);
        }
        if (((pIVar14->inst_).opcode == 0x19) &&
           (uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar14,6), uVar7 == 2)) {
          local_2c8._0_4_ = (inst->inst_).result_id;
          local_228._0_8_ = &_->pointer_to_storage_image_;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ();
        }
      }
      bVar4 = ValidationState_t::IsValidStorageClass(_,SVar12);
      sVar11 = SPV_SUCCESS;
      if (bVar4) break;
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_BINARY,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2c8,_,0x1223,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
      pcVar33 = "Invalid storage class for target environment";
      lVar28 = 0x2c;
    }
LAB_0066a312:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar33,lVar28);
    sVar11 = local_58;
LAB_0066a320:
    if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
      operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
    }
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
    break;
  case 0x21:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar14 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar14 == (Instruction *)0x0) ||
       (iVar6 = spvOpcodeGeneratesType((uint)(pIVar14->inst_).opcode), iVar6 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"OpTypeFunction Return Type <id> ",0x20);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
      pcVar33 = " is not a type.";
      lVar28 = 0xf;
      goto LAB_0066999c;
    }
    bVar5 = (ulong)((long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x21;
    bVar4 = !bVar5;
    if (bVar5) {
      uVar15 = 0;
    }
    else {
      sVar35 = 2;
      bVar4 = true;
      do {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,sVar35);
        pIVar14 = ValidationState_t::FindDef(_,uVar7);
        if ((pIVar14 == (Instruction *)0x0) ||
           (iVar6 = spvOpcodeGeneratesType((uint)(pIVar14->inst_).opcode), iVar6 == 0)) {
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"OpTypeFunction Parameter Type <id> ",0x23);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
          lVar28 = 0xf;
          pcVar33 = " is not a type.";
LAB_006693c9:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar33,lVar28);
          local_290 = (__buckets_ptr)CONCAT44(local_290._4_4_,local_58);
          if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
            operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if ((pIVar14->inst_).opcode == 0x13) {
            ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228,"OpTypeFunction Parameter Type <id> ",0x23);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
            lVar28 = 0x16;
            pcVar33 = " cannot be OpTypeVoid.";
            goto LAB_006693c9;
          }
        }
        if (!bVar5) break;
        sVar35 = sVar35 + 1;
        bVar4 = sVar35 < (ulong)((long)(inst->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(inst->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      } while (bVar4);
      uVar15 = sVar35 - 2;
      unaff_EBP = (spv_result_t)local_290;
    }
    if (!bVar4) {
      if ((_->options_->universal_limits_).max_function_args < uVar15) {
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"OpTypeFunction may not take more than ",0x26);
        std::ostream::_M_insert<unsigned_long>((ulong)local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228," arguments. OpTypeFunction <id> ",0x20);
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,0);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228," has ",5);
        std::ostream::_M_insert<unsigned_long>((ulong)local_228);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228," arguments.",0xb);
        unaff_EBP = local_58;
        if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
          operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
        }
        goto LAB_0066a20c;
      }
      ppVar3 = (inst->uses_).
               super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_290._0_4_ = unaff_EBP;
      for (ppVar31 = (inst->uses_).
                     super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar31 != ppVar3;
          ppVar31 = ppVar31 + 1) {
        pIVar14 = ppVar31->first;
        bVar4 = true;
        opcode = (Op)(pIVar14->inst_).opcode;
        if ((((opcode != OpFunction) && (bVar5 = spvOpcodeIsDebug(opcode), !bVar5)) &&
            (bVar5 = Instruction::IsNonSemantic(pIVar14), !bVar5)) &&
           (bVar5 = spvOpcodeIsDecoration((uint)(pIVar14->inst_).opcode), !bVar5)) {
          ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,pIVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"Invalid use of function type result id ",0x27);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_2c8,_,(inst->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,(char *)local_2c8._0_8_,local_2c8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,".",1);
          local_290._0_4_ = local_58;
          if ((ValidationState_t *)local_2c8._0_8_ != (ValidationState_t *)local_2b8) {
            operator_delete((void *)local_2c8._0_8_,local_2b8._0_8_ + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
          bVar4 = false;
        }
        unaff_EBP = (spv_result_t)local_290;
        if (!bVar4) goto LAB_0066ae28;
      }
      unaff_EBP = SPV_SUCCESS;
    }
    goto LAB_0066ae28;
  case 0x27:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar14 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar14->inst_).opcode == 0x20) {
      SVar12 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
      SVar10 = Instruction::GetOperandAs<spv::StorageClass>(pIVar14,1);
      if (SVar12 == SVar10) {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar14,2);
        pIVar14 = ValidationState_t::FindDef(_,uVar7);
        if ((pIVar14 != (Instruction *)0x0) && ((pIVar14->inst_).opcode == 0x1e)) {
          bVar4 = spvIsVulkanEnv(_->context_->target_env);
          unaff_EBP = SPV_SUCCESS;
          if ((SVar12 == PhysicalStorageBuffer) || (!bVar4)) goto LAB_0066ae28;
          pDVar21 = (DiagnosticStream *)local_228;
          ValidationState_t::diag(pDVar21,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2c8,_,0x1267,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar21,(char *)local_2c8._0_8_,local_2c8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar21,"In Vulkan, OpTypeForwardPointer must have ",0x2a);
          pcVar33 = "a storage class of PhysicalStorageBuffer.";
          lVar28 = 0x29;
LAB_00669bb9:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21,pcVar33,lVar28);
          local_58 = pDVar21->error_;
          goto LAB_006699ac;
        }
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
        pcVar33 = "Forward pointers must point to a structure";
        lVar28 = 0x2a;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"Storage class in OpTypeForwardPointer does not match the ",
                   0x39);
        pcVar33 = "pointer definition.";
        lVar28 = 0x13;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar33 = "Pointer type in OpTypeForwardPointer is not a pointer type.";
      lVar28 = 0x3b;
    }
LAB_0066a65f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar33,lVar28);
LAB_0066a670:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
    unaff_EBP = local_58;
LAB_0066ae28:
    if (unaff_EBP != SPV_SUCCESS) {
      return unaff_EBP;
    }
    goto switchD_0066819e_caseD_19;
  }
joined_r0x0066a349:
  if (sVar11 == SPV_SUCCESS) {
switchD_0066819e_caseD_19:
    sVar11 = SPV_SUCCESS;
  }
  return sVar11;
}

Assistant:

spv_result_t TypePass(ValidationState_t& _, const Instruction* inst) {
  if (!spvOpcodeGeneratesType(inst->opcode()) &&
      inst->opcode() != spv::Op::OpTypeForwardPointer) {
    return SPV_SUCCESS;
  }

  if (auto error = ValidateUniqueness(_, inst)) return error;

  switch (inst->opcode()) {
    case spv::Op::OpTypeInt:
      if (auto error = ValidateTypeInt(_, inst)) return error;
      break;
    case spv::Op::OpTypeFloat:
      if (auto error = ValidateTypeFloat(_, inst)) return error;
      break;
    case spv::Op::OpTypeVector:
      if (auto error = ValidateTypeVector(_, inst)) return error;
      break;
    case spv::Op::OpTypeMatrix:
      if (auto error = ValidateTypeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeArray:
      if (auto error = ValidateTypeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeRuntimeArray:
      if (auto error = ValidateTypeRuntimeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeStruct:
      if (auto error = ValidateTypeStruct(_, inst)) return error;
      break;
    case spv::Op::OpTypePointer:
      if (auto error = ValidateTypePointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeFunction:
      if (auto error = ValidateTypeFunction(_, inst)) return error;
      break;
    case spv::Op::OpTypeForwardPointer:
      if (auto error = ValidateTypeForwardPointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      if (auto error = ValidateTypeCooperativeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeCooperativeVectorNV:
      if (auto error = ValidateTypeCooperativeVectorNV(_, inst)) return error;
      break;
    case spv::Op::OpTypeUntypedPointerKHR:
      if (auto error = ValidateTypeUntypedPointerKHR(_, inst)) return error;
      break;
    case spv::Op::OpTypeTensorLayoutNV:
      if (auto error = ValidateTypeTensorLayoutNV(_, inst)) return error;
      break;
    case spv::Op::OpTypeTensorViewNV:
      if (auto error = ValidateTypeTensorViewNV(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}